

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jwt.h
# Opt level: O0

void __thiscall jwt::decoded_jwt::decoded_jwt(decoded_jwt *this,string *token)

{
  invalid_argument *piVar1;
  string *psVar2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>_>
  local_1d0;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>_>
  local_198;
  undefined1 local_159;
  undefined1 local_158 [7];
  anon_class_1_0_00000001 parse_claims;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  long local_38;
  size_type payload_end;
  size_type hdr_end;
  string *local_18;
  string *token_local;
  decoded_jwt *this_local;
  
  local_18 = token;
  token_local = (string *)this;
  header::header(&this->super_header);
  payload::payload(&this->super_payload);
  std::__cxx11::string::string((string *)&this->token,(string *)local_18);
  std::__cxx11::string::string((string *)&this->header);
  std::__cxx11::string::string((string *)&this->header_base64);
  std::__cxx11::string::string((string *)&this->payload);
  std::__cxx11::string::string((string *)&this->payload_base64);
  std::__cxx11::string::string((string *)&this->signature);
  std::__cxx11::string::string((string *)&this->signature_base64);
  payload_end = std::__cxx11::string::find((char)local_18,0x2e);
  if (payload_end == 0xffffffffffffffff) {
    piVar1 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar1,"invalid token supplied");
    __cxa_throw(piVar1,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_38 = std::__cxx11::string::find((char)local_18,0x2e);
  if (local_38 == -1) {
    piVar1 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar1,"invalid token supplied");
    __cxa_throw(piVar1,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__cxx11::string::substr((ulong)local_58,(ulong)local_18);
  psVar2 = (string *)std::__cxx11::string::operator=((string *)&this->header_base64,local_58);
  std::__cxx11::string::operator=((string *)&this->header,psVar2);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::substr((ulong)local_78,(ulong)local_18);
  psVar2 = (string *)std::__cxx11::string::operator=((string *)&this->payload_base64,local_78);
  std::__cxx11::string::operator=((string *)&this->payload,psVar2);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::substr((ulong)local_98,(ulong)local_18);
  psVar2 = (string *)std::__cxx11::string::operator=((string *)&this->signature_base64,local_98);
  std::__cxx11::string::operator=((string *)&this->signature,psVar2);
  std::__cxx11::string::~string(local_98);
  base::pad<jwt::alphabet::base64url>(&local_b8,&this->header);
  std::__cxx11::string::operator=((string *)&this->header,(string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  base::pad<jwt::alphabet::base64url>(&local_d8,&this->payload);
  std::__cxx11::string::operator=((string *)&this->payload,(string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  base::pad<jwt::alphabet::base64url>(&local_f8,&this->signature);
  std::__cxx11::string::operator=((string *)&this->signature,(string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  base::decode<jwt::alphabet::base64url>(&local_118,&this->header);
  std::__cxx11::string::operator=((string *)&this->header,(string *)&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  base::decode<jwt::alphabet::base64url>(&local_138,&this->payload);
  std::__cxx11::string::operator=((string *)&this->payload,(string *)&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  base::decode<jwt::alphabet::base64url>((string *)local_158,&this->signature);
  std::__cxx11::string::operator=((string *)&this->signature,(string *)local_158);
  std::__cxx11::string::~string((string *)local_158);
  decoded_jwt(std::__cxx11::string_const&)::{lambda(std::__cxx11::string_const&)#1}::operator()::
  string_const___const(&local_198,&local_159,&this->header);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>_>
  ::operator=((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>_>
               *)this,&local_198);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>_>
  ::~unordered_map(&local_198);
  decoded_jwt(std::__cxx11::string_const&)::{lambda(std::__cxx11::string_const&)#1}::operator()::
  string_const___const(&local_1d0,&local_159,&this->payload);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>_>
  ::operator=(&(this->super_payload).payload_claims,&local_1d0);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>_>
  ::~unordered_map(&local_1d0);
  return;
}

Assistant:

explicit decoded_jwt(const std::string& token)
			: token(token)
		{
			auto hdr_end = token.find('.');
			if (hdr_end == std::string::npos)
				throw std::invalid_argument("invalid token supplied");
			auto payload_end = token.find('.', hdr_end + 1);
			if (payload_end == std::string::npos)
				throw std::invalid_argument("invalid token supplied");
			header = header_base64 = token.substr(0, hdr_end);
			payload = payload_base64 = token.substr(hdr_end + 1, payload_end - hdr_end - 1);
			signature = signature_base64 = token.substr(payload_end + 1);

			// Fix padding: JWT requires padding to get removed
			header = base::pad<alphabet::base64url>(header);
			payload = base::pad<alphabet::base64url>(payload);
			signature = base::pad<alphabet::base64url>(signature);

			header = base::decode<alphabet::base64url>(header);
			payload = base::decode<alphabet::base64url>(payload);
			signature = base::decode<alphabet::base64url>(signature);

			auto parse_claims = [](const std::string& str) {
				std::unordered_map<std::string, claim> res;
				picojson::value val;
				if (!picojson::parse(val, str).empty())
					throw std::runtime_error("Invalid json");

				for (auto& e : val.get<picojson::object>()) { res.insert({ e.first, claim(e.second) }); }

				return res;
			};

			header_claims = parse_claims(header);
			payload_claims = parse_claims(payload);
		}